

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O0

void __thiscall
MxxColl_All2allGeneral_Test::MxxColl_All2allGeneral_Test(MxxColl_All2allGeneral_Test *this)

{
  MxxColl_All2allGeneral_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__MxxColl_All2allGeneral_Test_001e6b28;
  return;
}

Assistant:

TEST(MxxColl, All2allGeneral) {
    mxx::comm c;

    int size = 230;
    std::vector<int> msgs(size*c.size());
    for (int i = 0; i < c.size(); ++i) {
        for (int j = 0; j < size; ++j) {
            msgs[i*size + j] = i*c.rank()*33 - 2*j;
        }
    }

    std::vector<int> result = mxx::all2all(msgs);
    ASSERT_EQ(size*c.size(), (int)result.size());
    for (int i = 0; i < c.size(); ++i) {
        for (int j = 0; j < size; ++j) {
            ASSERT_EQ(i*c.rank()*33 - 2*j, result[i*size + j]);
        }
    }
}